

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O0

bool __thiscall QHostAddress::isEqual(QHostAddress *this,QHostAddress *other,ConversionMode mode)

{
  quint32 qVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [11];
  undefined1 auVar5 [12];
  undefined1 auVar6 [13];
  undefined1 auVar7 [14];
  bool bVar8;
  Int IVar9;
  int iVar10;
  QHostAddressPrivate *pQVar11;
  QHostAddressPrivate *pQVar12;
  undefined4 in_EDX;
  long in_FS_OFFSET;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  byte bVar28;
  quint32 a4_1;
  quint32 a4;
  undefined4 in_stack_ffffffffffffff68;
  ConversionModeFlag in_stack_ffffffffffffff6c;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined2 in_stack_ffffffffffffff84;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  bool local_69;
  bool local_5d;
  bool local_55;
  ulong in_stack_ffffffffffffffb0;
  QFlagsStorage<QHostAddress::ConversionModeFlag> mode_00;
  bool local_29;
  QFlagsStorageHelper<QHostAddress::ConversionModeFlag,_4> local_28;
  QFlagsStorageHelper<QHostAddress::ConversionModeFlag,_4> local_24;
  undefined4 local_20;
  quint32 local_1c;
  QFlagsStorageHelper<QHostAddress::ConversionModeFlag,_4> local_18;
  undefined4 local_14;
  quint32 local_10;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_EDX;
  bVar8 = ::operator==((QExplicitlySharedDataPointer<QHostAddressPrivate> *)
                       CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                       (QExplicitlySharedDataPointer<QHostAddressPrivate> *)
                       CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (bVar8) {
    local_29 = true;
    goto LAB_002178cc;
  }
  pQVar11 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                      ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x2174eb);
  if (pQVar11->protocol == '\0') {
    pQVar11 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                        ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x217502);
    in_stack_ffffffffffffffb0 = (ulong)((int)pQVar11->protocol + 1);
    switch(in_stack_ffffffffffffffb0) {
    case 0:
      local_29 = false;
      break;
    case 1:
      pQVar11 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                          ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x217538);
      qVar1 = pQVar11->a;
      pQVar11 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                          ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x217549);
      local_29 = qVar1 == pQVar11->a;
      break;
    case 2:
      local_10 = 0xaaaaaaaa;
      QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x217576);
      local_14 = local_c;
      bVar8 = convertToIpv4((quint32 *)
                            CONCAT17(in_stack_ffffffffffffff87,
                                     CONCAT16(in_stack_ffffffffffffff86,
                                              CONCAT24(in_stack_ffffffffffffff84,
                                                       in_stack_ffffffffffffff80))),
                            (Q_IPV6ADDR *)
                            CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                            (QFlagsStorageHelper<QHostAddress::ConversionModeFlag,_4>)
                            SUB84(in_stack_ffffffffffffffb0 >> 0x20,0));
      qVar1 = local_10;
      local_55 = false;
      if (bVar8) {
        pQVar11 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                            ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x2175c3);
        local_55 = qVar1 == pQVar11->a;
      }
      local_29 = local_55;
      break;
    case 3:
      local_18.super_QFlagsStorage<QHostAddress::ConversionModeFlag>.i =
           (QFlagsStorage<QHostAddress::ConversionModeFlag>)
           QFlags<QHostAddress::ConversionModeFlag>::operator&
                     ((QFlags<QHostAddress::ConversionModeFlag> *)
                      CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                      in_stack_ffffffffffffff6c);
      IVar9 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_18);
      local_5d = false;
      if (IVar9 != 0) {
        pQVar11 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                            ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x217620);
        local_5d = pQVar11->a == 0;
      }
      local_29 = local_5d;
      break;
    default:
      goto switchD_0021752b_default;
    }
    goto LAB_002178cc;
  }
switchD_0021752b_default:
  mode_00.i = (Int)(in_stack_ffffffffffffffb0 >> 0x20);
  pQVar11 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                      ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x217650);
  if (pQVar11->protocol == '\x01') {
    pQVar11 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                        ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x217667);
    switch(pQVar11->protocol) {
    case '\0':
      local_1c = 0xaaaaaaaa;
      QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x2176a5);
      local_20 = local_c;
      bVar8 = convertToIpv4((quint32 *)
                            CONCAT17(in_stack_ffffffffffffff87,
                                     CONCAT16(in_stack_ffffffffffffff86,
                                              CONCAT24(in_stack_ffffffffffffff84,
                                                       in_stack_ffffffffffffff80))),
                            (Q_IPV6ADDR *)
                            CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                            (ConversionMode)mode_00.i);
      qVar1 = local_1c;
      local_69 = false;
      if (bVar8) {
        pQVar11 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                            ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x2176e6);
        local_69 = qVar1 == pQVar11->a;
      }
      local_29 = local_69;
      break;
    case '\x01':
      pQVar11 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                          ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x217710);
      pQVar12 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                          ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x217723);
      cVar13 = -((pQVar11->field_1).a6.c[0] == (pQVar12->field_1).a6.c[0]);
      cVar14 = -((pQVar11->field_1).a6.c[1] == (pQVar12->field_1).a6.c[1]);
      cVar15 = -((pQVar11->field_1).a6.c[2] == (pQVar12->field_1).a6.c[2]);
      cVar16 = -((pQVar11->field_1).a6.c[3] == (pQVar12->field_1).a6.c[3]);
      cVar17 = -((pQVar11->field_1).a6.c[4] == (pQVar12->field_1).a6.c[4]);
      cVar18 = -((pQVar11->field_1).a6.c[5] == (pQVar12->field_1).a6.c[5]);
      cVar19 = -((pQVar11->field_1).a6.c[6] == (pQVar12->field_1).a6.c[6]);
      cVar20 = -((pQVar11->field_1).a6.c[7] == (pQVar12->field_1).a6.c[7]);
      cVar21 = -((pQVar11->field_1).a6.c[8] == (pQVar12->field_1).a6.c[8]);
      cVar22 = -((pQVar11->field_1).a6.c[9] == (pQVar12->field_1).a6.c[9]);
      cVar23 = -((pQVar11->field_1).a6.c[10] == (pQVar12->field_1).a6.c[10]);
      cVar24 = -((pQVar11->field_1).a6.c[0xb] == (pQVar12->field_1).a6.c[0xb]);
      cVar25 = -((pQVar11->field_1).a6.c[0xc] == (pQVar12->field_1).a6.c[0xc]);
      cVar26 = -((pQVar11->field_1).a6.c[0xd] == (pQVar12->field_1).a6.c[0xd]);
      cVar27 = -((pQVar11->field_1).a6.c[0xe] == (pQVar12->field_1).a6.c[0xe]);
      bVar28 = -((pQVar11->field_1).a6.c[0xf] == (pQVar12->field_1).a6.c[0xf]);
      auVar2[1] = cVar14;
      auVar2[0] = cVar13;
      auVar2[2] = cVar15;
      auVar2[3] = cVar16;
      auVar2[4] = cVar17;
      auVar2[5] = cVar18;
      auVar2[6] = cVar19;
      auVar2[7] = cVar20;
      auVar2[8] = cVar21;
      auVar2[9] = cVar22;
      auVar2[10] = cVar23;
      auVar2[0xb] = cVar24;
      auVar2[0xc] = cVar25;
      auVar2[0xd] = cVar26;
      auVar2[0xe] = cVar27;
      auVar2[0xf] = bVar28;
      auVar3[1] = cVar14;
      auVar3[0] = cVar13;
      auVar3[2] = cVar15;
      auVar3[3] = cVar16;
      auVar3[4] = cVar17;
      auVar3[5] = cVar18;
      auVar3[6] = cVar19;
      auVar3[7] = cVar20;
      auVar3[8] = cVar21;
      auVar3[9] = cVar22;
      auVar3[10] = cVar23;
      auVar3[0xb] = cVar24;
      auVar3[0xc] = cVar25;
      auVar3[0xd] = cVar26;
      auVar3[0xe] = cVar27;
      auVar3[0xf] = bVar28;
      auVar7[1] = cVar16;
      auVar7[0] = cVar15;
      auVar7[2] = cVar17;
      auVar7[3] = cVar18;
      auVar7[4] = cVar19;
      auVar7[5] = cVar20;
      auVar7[6] = cVar21;
      auVar7[7] = cVar22;
      auVar7[8] = cVar23;
      auVar7[9] = cVar24;
      auVar7[10] = cVar25;
      auVar7[0xb] = cVar26;
      auVar7[0xc] = cVar27;
      auVar7[0xd] = bVar28;
      auVar6[1] = cVar17;
      auVar6[0] = cVar16;
      auVar6[2] = cVar18;
      auVar6[3] = cVar19;
      auVar6[4] = cVar20;
      auVar6[5] = cVar21;
      auVar6[6] = cVar22;
      auVar6[7] = cVar23;
      auVar6[8] = cVar24;
      auVar6[9] = cVar25;
      auVar6[10] = cVar26;
      auVar6[0xb] = cVar27;
      auVar6[0xc] = bVar28;
      auVar5[1] = cVar18;
      auVar5[0] = cVar17;
      auVar5[2] = cVar19;
      auVar5[3] = cVar20;
      auVar5[4] = cVar21;
      auVar5[5] = cVar22;
      auVar5[6] = cVar23;
      auVar5[7] = cVar24;
      auVar5[8] = cVar25;
      auVar5[9] = cVar26;
      auVar5[10] = cVar27;
      auVar5[0xb] = bVar28;
      auVar4[1] = cVar19;
      auVar4[0] = cVar18;
      auVar4[2] = cVar20;
      auVar4[3] = cVar21;
      auVar4[4] = cVar22;
      auVar4[5] = cVar23;
      auVar4[6] = cVar24;
      auVar4[7] = cVar25;
      auVar4[8] = cVar26;
      auVar4[9] = cVar27;
      auVar4[10] = bVar28;
      local_29 = (ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB141(auVar7 >> 7,0) & 1) << 2 |
                          (ushort)(SUB131(auVar6 >> 7,0) & 1) << 3 |
                          (ushort)(SUB121(auVar5 >> 7,0) & 1) << 4 |
                          (ushort)(SUB111(auVar4 >> 7,0) & 1) << 5 |
                          (ushort)((byte)(CONCAT19(bVar28,CONCAT18(cVar27,CONCAT17(cVar26,CONCAT16(
                                                  cVar25,CONCAT15(cVar24,CONCAT14(cVar23,CONCAT13(
                                                  cVar22,CONCAT12(cVar21,CONCAT11(cVar20,cVar19)))))
                                                  )))) >> 7) & 1) << 6 |
                          (ushort)((byte)(CONCAT18(bVar28,CONCAT17(cVar27,CONCAT16(cVar26,CONCAT15(
                                                  cVar25,CONCAT14(cVar24,CONCAT13(cVar23,CONCAT12(
                                                  cVar22,CONCAT11(cVar21,cVar20)))))))) >> 7) & 1)
                          << 7 | (ushort)(bVar28 >> 7) << 0xf) == 0xffff;
      break;
    case '\x02':
      local_24.super_QFlagsStorage<QHostAddress::ConversionModeFlag>.i =
           (QFlagsStorage<QHostAddress::ConversionModeFlag>)
           QFlags<QHostAddress::ConversionModeFlag>::operator&
                     ((QFlags<QHostAddress::ConversionModeFlag> *)
                      CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                      in_stack_ffffffffffffff6c);
      IVar9 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_24);
      local_29 = false;
      if (IVar9 != 0) {
        pQVar11 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                            ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x217790);
        local_29 = false;
        if ((pQVar11->field_1).a6_64.c[0] == 0) {
          pQVar11 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                              ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x2177aa);
          local_29 = (pQVar11->field_1).a6_64.c[1] == 0;
        }
      }
      break;
    case -0xffffff01:
      local_29 = false;
      break;
    default:
      goto switchD_00217690_default;
    }
    goto LAB_002178cc;
  }
switchD_00217690_default:
  pQVar11 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                      ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x2177db);
  bVar8 = false;
  if (pQVar11->protocol == '\x02') {
    local_28.super_QFlagsStorage<QHostAddress::ConversionModeFlag>.i =
         (QFlagsStorage<QHostAddress::ConversionModeFlag>)
         QFlags<QHostAddress::ConversionModeFlag>::operator&
                   ((QFlags<QHostAddress::ConversionModeFlag> *)
                    CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                    in_stack_ffffffffffffff6c);
    IVar9 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_28);
    bVar8 = IVar9 != 0;
  }
  if (bVar8) {
    pQVar11 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                        ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x217828);
    if (pQVar11->protocol == '\0') {
      pQVar11 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                          ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x21784b);
      local_29 = pQVar11->a == 0;
      goto LAB_002178cc;
    }
    if (pQVar11->protocol == '\x01') {
      pQVar11 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                          ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x217864);
      local_29 = false;
      if ((pQVar11->field_1).a6_64.c[0] == 0) {
        pQVar11 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                            ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x21787e);
        local_29 = (pQVar11->field_1).a6_64.c[1] == 0;
      }
      goto LAB_002178cc;
    }
  }
  pQVar11 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                      ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x2178a4);
  iVar10 = (int)pQVar11->protocol;
  pQVar11 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                      ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x2178b6);
  local_29 = iVar10 == pQVar11->protocol;
LAB_002178cc:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_29;
}

Assistant:

bool QHostAddress::isEqual(const QHostAddress &other, ConversionMode mode) const
{
    if (d == other.d)
        return true;

    if (d->protocol == QHostAddress::IPv4Protocol) {
        switch (other.d->protocol) {
        case QHostAddress::IPv4Protocol:
            return d->a == other.d->a;
        case QHostAddress::IPv6Protocol:
            quint32 a4;
            return convertToIpv4(a4, other.d->a6, mode) && (a4 == d->a);
        case QHostAddress::AnyIPProtocol:
            return (mode & QHostAddress::ConvertUnspecifiedAddress) && d->a == 0;
        case QHostAddress::UnknownNetworkLayerProtocol:
            return false;
        }
    }

    if (d->protocol == QHostAddress::IPv6Protocol) {
        switch (other.d->protocol) {
        case QHostAddress::IPv4Protocol:
            quint32 a4;
            return convertToIpv4(a4, d->a6, mode) && (a4 == other.d->a);
        case QHostAddress::IPv6Protocol:
            return memcmp(&d->a6, &other.d->a6, sizeof(Q_IPV6ADDR)) == 0;
        case QHostAddress::AnyIPProtocol:
            return (mode & QHostAddress::ConvertUnspecifiedAddress)
                    && (d->a6_64.c[0] == 0) && (d->a6_64.c[1] == 0);
        case QHostAddress::UnknownNetworkLayerProtocol:
            return false;
        }
    }

    if ((d->protocol == QHostAddress::AnyIPProtocol)
            && (mode & QHostAddress::ConvertUnspecifiedAddress)) {
        switch (other.d->protocol) {
        case QHostAddress::IPv4Protocol:
            return other.d->a == 0;
        case QHostAddress::IPv6Protocol:
            return (other.d->a6_64.c[0] == 0) && (other.d->a6_64.c[1] == 0);
        default:
            break;
        }
    }

    return d->protocol == other.d->protocol;
}